

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O2

void __thiscall
so_5::impl::map_based_subscr_storage::storage_t::storage_t(storage_t *this,agent_t *owner)

{
  _Rb_tree_header *p_Var1;
  
  subscription_storage_t::subscription_storage_t(&this->super_subscription_storage_t,owner);
  p_Var1 = &(this->m_events)._M_t._M_impl.super__Rb_tree_header;
  (this->super_subscription_storage_t)._vptr_subscription_storage_t =
       (_func_int **)&PTR__storage_t_002c7970;
  (this->m_events)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_events)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_events)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_events)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_events)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

storage_t::storage_t( agent_t * owner )
	:	subscription_storage_t( owner )
	{}